

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_sparse.hpp
# Opt level: O1

void __thiscall
boost::numeric::ublas::
sparse_vector_element<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
::set(sparse_vector_element<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
      *this,value_type *s)

{
  pointer puVar1;
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *this_00;
  ulong uVar2;
  ulong uVar3;
  pointer puVar4;
  size_type sVar5;
  pointer pdVar6;
  ulong uVar7;
  pointer puVar8;
  size_type sVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  pointer puVar13;
  value_type *__src;
  
  this_00 = (this->
            super_container_reference<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
            ).c_;
  uVar2 = this->i_;
  uVar3 = this_00->filled_;
  puVar4 = (this_00->index_data_).data_;
  puVar1 = puVar4 + uVar3;
  puVar13 = puVar4;
  if (((uVar3 != 0) && (*puVar4 < uVar2)) &&
     (puVar13 = puVar1, uVar12 = uVar3, puVar8 = puVar4, uVar2 <= puVar1[-1])) {
    while (puVar13 = puVar8, uVar7 = uVar12, 0 < (long)uVar7) {
      uVar11 = uVar7 >> 1;
      uVar12 = uVar11;
      puVar8 = puVar13;
      if (puVar13[uVar11] < uVar2) {
        uVar12 = ~uVar11 + uVar7;
        puVar8 = puVar13 + uVar11 + 1;
      }
    }
  }
  if ((puVar13 == puVar1) || (*puVar13 != uVar2)) {
    __src = (value_type *)0x0;
  }
  else {
    __src = (value_type *)(((long)puVar13 - (long)puVar4) + (long)(this_00->value_data_).data_);
  }
  if (__src == (value_type *)0x0) {
    if (this_00->capacity_ <= uVar3) {
      compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::reserve(this_00,this_00->capacity_ * 2,true);
    }
    sVar5 = this_00->filled_;
    puVar4 = (this_00->index_data_).data_;
    puVar1 = puVar4 + sVar5;
    puVar13 = puVar4;
    if (((sVar5 != 0) && (*puVar4 < uVar2)) &&
       (puVar13 = puVar1, sVar9 = sVar5, puVar8 = puVar4, uVar2 <= puVar1[-1])) {
      while (puVar13 = puVar8, uVar3 = sVar9, 0 < (long)uVar3) {
        uVar12 = uVar3 >> 1;
        sVar9 = uVar12;
        puVar8 = puVar13;
        if (puVar13[uVar12] < uVar2) {
          sVar9 = ~uVar12 + uVar3;
          puVar8 = puVar13 + uVar12 + 1;
        }
      }
    }
    this_00->filled_ = sVar5 + 1;
    sVar10 = (long)puVar1 - (long)puVar13;
    if (sVar10 != 0) {
      memmove((void *)((long)puVar4 + ((sVar5 * 8 + 8) - sVar10)),puVar13,sVar10);
    }
    *puVar13 = uVar2;
    pdVar6 = (this_00->value_data_).data_;
    __src = (value_type *)(((long)puVar13 - (long)puVar4) + (long)pdVar6);
    sVar10 = (long)pdVar6 + ((this_00->filled_ * 8 + -8) - (long)__src);
    if (sVar10 != 0) {
      memmove((void *)((long)pdVar6 + (this_00->filled_ * 8 - sVar10)),__src,sVar10);
    }
  }
  *__src = *s;
  return;
}

Assistant:

void set (const value_type &s) const {
            pointer p = (*this) ().find_element (i_);
            if (!p)
                (*this) ().insert_element (i_, s);
            else
                *p = s;
        }